

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlineedit.cpp
# Opt level: O0

void __thiscall QLineEdit::mouseReleaseEvent(QLineEdit *this,QMouseEvent *e)

{
  bool bVar1;
  MouseButton MVar2;
  QLineEditPrivate *this_00;
  ulong uVar3;
  EVP_PKEY_CTX *src;
  QSinglePointEvent *in_RSI;
  QPointF *in_RDI;
  long in_FS_OFFSET;
  QLineEditPrivate *d;
  undefined1 in_stack_ffffffffffffff9b;
  Mode in_stack_ffffffffffffff9c;
  QWidgetLineControl *in_stack_ffffffffffffffa0;
  byte local_51;
  QLineEditPrivate *pQVar4;
  QPointF *e_00;
  QLineEditPrivate *in_stack_ffffffffffffffd0;
  QPoint local_20;
  QRect local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  e_00 = in_RDI;
  this_00 = d_func((QLineEdit *)0x5c63bf);
  bVar1 = QLineEditPrivate::sendMouseEventToInputContext
                    (in_stack_ffffffffffffffd0,(QMouseEvent *)e_00);
  if (!bVar1) {
    MVar2 = QSinglePointEvent::button(in_RSI);
    if ((MVar2 == LeftButton) && (bVar1 = QBasicTimer::isActive(&this_00->dndTimer), bVar1)) {
      QBasicTimer::stop();
      deselect((QLineEdit *)in_stack_ffffffffffffffa0);
    }
    else {
      QGuiApplication::clipboard();
      uVar3 = QClipboard::supportsSelection();
      if ((uVar3 & 1) != 0) {
        MVar2 = QSinglePointEvent::button(in_RSI);
        if (MVar2 == LeftButton) {
          QWidgetLineControl::copy((QWidgetLineControl *)this_00->control,(EVP_PKEY_CTX *)0x1,src);
        }
        else {
          bVar1 = QWidgetLineControl::isReadOnly((QWidgetLineControl *)this_00->control);
          if ((!bVar1) && (MVar2 = QSinglePointEvent::button(in_RSI), MVar2 == MiddleButton)) {
            deselect((QLineEdit *)in_stack_ffffffffffffffa0);
            QWidgetLineControl::paste(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c);
          }
        }
      }
      bVar1 = isReadOnly((QLineEdit *)in_stack_ffffffffffffffa0);
      local_51 = 0;
      if (!bVar1) {
        local_18 = QWidget::rect((QWidget *)this_00);
        QSinglePointEvent::position((QSinglePointEvent *)0x5c64dd);
        local_20 = QPointF::toPoint(in_RDI);
        local_51 = QRect::contains((QPoint *)&local_18,SUB81(&local_20,0));
      }
      if ((local_51 & 1) != 0) {
        pQVar4 = this_00;
        QSinglePointEvent::button(in_RSI);
        QWidgetPrivate::handleSoftwareInputPanel
                  (&this_00->super_QWidgetPrivate,in_stack_ffffffffffffff9c,
                   (bool)in_stack_ffffffffffffff9b);
        this_00 = pQVar4;
      }
      this_00->field_0x27c = this_00->field_0x27c & 0xef;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QLineEdit::mouseReleaseEvent(QMouseEvent* e)
{
    Q_D(QLineEdit);
    if (d->sendMouseEventToInputContext(e))
        return;
#if QT_CONFIG(draganddrop)
    if (e->button() == Qt::LeftButton) {
        if (d->dndTimer.isActive()) {
            d->dndTimer.stop();
            deselect();
            return;
        }
    }
#endif
#ifndef QT_NO_CLIPBOARD
    if (QGuiApplication::clipboard()->supportsSelection()) {
        if (e->button() == Qt::LeftButton) {
            d->control->copy(QClipboard::Selection);
        } else if (!d->control->isReadOnly() && e->button() == Qt::MiddleButton) {
            deselect();
            d->control->paste(QClipboard::Selection);
        }
    }
#endif

    if (!isReadOnly() && rect().contains(e->position().toPoint()))
        d->handleSoftwareInputPanel(e->button(), d->clickCausedFocus);
    d->clickCausedFocus = 0;
}